

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O3

float __thiscall benchmark_4::run_kernel(benchmark_4 *this,size_t iterations)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 in_register_00000004;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar14 [64];
  undefined1 auVar11 [64];
  
  uVar3 = rdtsc();
  uVar4 = rdtsc();
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  auVar10 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,
                               uVar4 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar4));
  uVar8 = auVar10._0_4_;
  auVar12 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(uVar8
                                                  ,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
  auVar10 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,
                               uVar3 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  auVar1 = *(undefined1 (*) [32])(this->super_benchmark).mul0;
  auVar2 = *(undefined1 (*) [32])(this->super_benchmark).mul1;
  uVar8 = auVar5._0_4_;
  auVar11 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(uVar8
                                                  ,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
  uVar8 = auVar10._0_4_;
  auVar13 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(uVar8
                                                  ,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar8 = auVar5._0_4_;
  auVar14 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(uVar8
                                                  ,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
  do {
    auVar5 = vfmadd231ps_fma(auVar11._0_32_,auVar1,auVar2);
    auVar11 = ZEXT1664(auVar5);
    auVar10 = vfmadd231ps_fma(auVar12._0_32_,auVar1,auVar2);
    auVar12 = ZEXT1664(auVar10);
    auVar6 = vfmadd231ps_fma(auVar13._0_32_,auVar1,auVar2);
    auVar13 = ZEXT1664(auVar6);
    auVar7 = vfmadd231ps_fma(auVar14._0_32_,auVar1,auVar2);
    auVar14 = ZEXT1664(auVar7);
    iterations = iterations - 1;
  } while (iterations != 0);
  auVar9._0_4_ = auVar5._0_4_ + auVar6._0_4_ + auVar10._0_4_ + auVar7._0_4_ + 0.0;
  auVar9._4_4_ = auVar5._4_4_ + auVar6._4_4_ + auVar10._4_4_ + auVar7._4_4_ + 0.0;
  auVar9._8_4_ = auVar5._8_4_ + auVar6._8_4_ + auVar10._8_4_ + auVar7._8_4_ + 0.0;
  auVar9._12_4_ = auVar5._12_4_ + auVar6._12_4_ + auVar10._12_4_ + auVar7._12_4_ + 0.0;
  auVar5 = vshufpd_avx(auVar9,auVar9,1);
  auVar10._0_4_ = auVar9._0_4_ + auVar5._0_4_;
  auVar10._4_4_ = auVar9._4_4_ + auVar5._4_4_;
  auVar10._8_4_ = auVar9._8_4_ + auVar5._8_4_;
  auVar10._12_4_ = auVar9._12_4_ + auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar10,auVar10);
  return auVar5._0_4_;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r2);
            r1 = _mm256_add_ps(r1, r3);

            r0 = _mm256_add_ps(r0, r1);
            return __m256_reduce_add_ps(r0);
    }